

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O1

void printDefines(FILE *out,TA_FuncInfo *funcInfo)

{
  TA_OptInputParameterType TVar1;
  TA_IntegerList *pTVar2;
  long *plVar3;
  TA_RetCode TVar4;
  __int32_t **pp_Var5;
  char *pcVar6;
  char *pcVar7;
  char cVar8;
  uint paramIndex;
  ulong uVar9;
  TA_OptInputParameterInfo *optInputParamInfo;
  TA_OptInputParameterInfo *local_40;
  TA_IntegerList *local_38;
  
  if ((out != (FILE *)0x0) && (funcInfo->nbOptInput != 0)) {
    local_38 = &TA_MA_TypeList;
    paramIndex = 0;
    do {
      TVar4 = TA_GetOptInputParameterInfo(funcInfo->handle,paramIndex,&local_40);
      if (TVar4 != TA_SUCCESS) {
        printf("[%s] invalid \'optional input\' information\n",funcInfo->name);
        return;
      }
      TVar1 = local_40->type;
      pcVar6 = "optInReal";
      if (TVar1 == TA_OptInput_RealList) {
LAB_001172bf:
        if (local_40->paramName != (char *)0x0) {
          pcVar6 = local_40->paramName;
        }
        if (TVar1 == TA_OptInput_RealList) {
          fprintf((FILE *)out,"\n/* TA_%s: Optional Parameter %s */\n",funcInfo->name,pcVar6);
          plVar3 = (long *)local_40->dataSet;
          if ((int)plVar3[1] != 0) {
            uVar9 = 0;
LAB_001173dd:
            pcVar7 = gTempBuf;
            strcpy(gTempBuf,*(char **)(*plVar3 + 8 + uVar9 * 0x10));
            pcVar6 = gTempBuf;
            do {
              if (*pcVar6 == ' ') {
                *pcVar6 = '_';
              }
              else if (*pcVar6 == '\0') goto LAB_0011740e;
              pcVar6 = pcVar6 + 1;
            } while( true );
          }
        }
        else {
          if ((TVar1 != TA_OptInput_IntegerList) ||
             (pTVar2 = (TA_IntegerList *)local_40->dataSet, pTVar2 == local_38)) goto LAB_001174a6;
          fprintf((FILE *)out,"\n/* TA_%s: Optional Parameter %s */\n",funcInfo->name,pcVar6);
          if (pTVar2->nbElement != 0) {
            uVar9 = 0;
LAB_0011730f:
            pcVar7 = gTempBuf;
            strcpy(gTempBuf,pTVar2->data[uVar9].string);
            pcVar6 = gTempBuf;
            do {
              if (*pcVar6 == ' ') {
                *pcVar6 = '_';
              }
              else if (*pcVar6 == '\0') goto LAB_00117340;
              pcVar6 = pcVar6 + 1;
            } while( true );
          }
        }
LAB_00117486:
        fputc(10,(FILE *)out);
      }
      else if (TVar1 == TA_OptInput_IntegerList) {
        pcVar6 = "optInInteger";
        goto LAB_001172bf;
      }
LAB_001174a6:
      paramIndex = paramIndex + 1;
    } while (paramIndex < funcInfo->nbOptInput);
  }
  return;
LAB_0011740e:
  trimWhitespace(pcVar7);
  cVar8 = gTempBuf[0];
  if (gTempBuf[0] != '\0') {
    pp_Var5 = __ctype_toupper_loc();
    pcVar6 = gTempBuf;
    do {
      pcVar6 = pcVar6 + 1;
      pcVar6[-1] = (char)(*pp_Var5)[cVar8];
      cVar8 = *pcVar6;
    } while (cVar8 != '\0');
  }
  pcVar6 = funcInfo->name;
  doubleToStr(*(double *)(*plVar3 + uVar9 * 0x10));
  fprintf((FILE *)out,"#define TA_%s_%s %s\n",pcVar6,gTempBuf,gTempDoubleToStr);
  uVar9 = uVar9 + 1;
  if (*(uint *)(plVar3 + 1) <= uVar9) goto LAB_00117486;
  goto LAB_001173dd;
LAB_00117340:
  trimWhitespace(pcVar7);
  cVar8 = gTempBuf[0];
  if (gTempBuf[0] != '\0') {
    pp_Var5 = __ctype_toupper_loc();
    pcVar6 = gTempBuf;
    do {
      pcVar6 = pcVar6 + 1;
      pcVar6[-1] = (char)(*pp_Var5)[cVar8];
      cVar8 = *pcVar6;
    } while (cVar8 != '\0');
  }
  fprintf((FILE *)out,"#define TA_%s_%s %d\n",funcInfo->name,gTempBuf,
          (ulong)(uint)pTVar2->data[uVar9].value);
  uVar9 = uVar9 + 1;
  if (pTVar2->nbElement <= uVar9) goto LAB_00117486;
  goto LAB_0011730f;
}

Assistant:

static void printDefines( FILE *out, const TA_FuncInfo *funcInfo )
{
   TA_RetCode retCode;
   const TA_OptInputParameterInfo *optInputParamInfo;
   unsigned int i, j;
   unsigned int paramNb;
   const char *paramName;
   const char *defaultParamName;
   TA_IntegerList *intList;
   TA_RealList    *realList;

   if (!out) return;

   /* Go through the optional parameter and print
    * the corresponding define for the TA_OptInput_IntegerList
    * and TA_OptInput_RealList having a string.
    */
   paramNb = 0;
   for( i=0; i < funcInfo->nbOptInput; i++ )
   {
      retCode = TA_GetOptInputParameterInfo( funcInfo->handle,
                                             i, &optInputParamInfo );

      if( retCode != TA_SUCCESS )
      {
         printf( "[%s] invalid 'optional input' information\n", funcInfo->name );
         return;
      }

      paramName = optInputParamInfo->paramName;

      /* TA_MA: Value for parameter */

      switch( optInputParamInfo->type )
      {
      case TA_OptInput_RealList:
         defaultParamName = "optInReal";
         break;
      case TA_OptInput_IntegerList:
         defaultParamName = "optInInteger";
         break;
      default:
         paramNb++;
         continue; /* Skip other type of parameter */
      }

      if( !paramName )
         paramName = defaultParamName;

      /* Output a comment to guide the user. */
         switch( optInputParamInfo->type )
         {
         case TA_OptInput_IntegerList:
            intList = (TA_IntegerList *)optInputParamInfo->dataSet;
            if( intList != (TA_IntegerList *)TA_DEF_UI_MA_Method.dataSet )
            {
               fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                        funcInfo->name, paramName );
               for( j=0; j < intList->nbElement; j++ )
               {
                  strcpy( gTempBuf, intList->data[j].string );
                  cnvtChar( gTempBuf, ' ', '_' );
                  trimWhitespace( gTempBuf );
                  cnvtToUpperCase( gTempBuf );
                  fprintf( out, "#define TA_%s_%s %d\n",
                           funcInfo->name,
                           gTempBuf,
                           intList->data[j].value );

               }
               fprintf( out, "\n" );
            }
            break;
         case TA_OptInput_RealList:
            fprintf( out, "\n/* TA_%s: Optional Parameter %s */\n",
                     funcInfo->name, paramName );

            realList = (TA_RealList *)optInputParamInfo->dataSet;
            for( j=0; j < realList->nbElement; j++ )
            {
               strcpy( gTempBuf, realList->data[j].string );
               cnvtChar( gTempBuf, ' ', '_' );
               trimWhitespace( gTempBuf );
               cnvtToUpperCase( gTempBuf );
               fprintf( out, "#define TA_%s_%s %s\n",
                        funcInfo->name,
                        gTempBuf,
                        doubleToStr(realList->data[j].value) );

            }
            fprintf( out, "\n" );
            break;
         default:
            /* Do nothing */
            break;
         }

      paramNb++;
   }
}